

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
CConnman::GetAddresses
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,CConnman *this,
          CNode *requestor,size_t max_addresses,size_t max_pct)

{
  uint16_t uVar1;
  Network NVar2;
  CSipHasher *pCVar3;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  tVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_> _Var5;
  long lVar6;
  uint64_t data;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data_00;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>,_bool>
  pVar7;
  uint64_t cache_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_socket_bytes;
  undefined1 local_c8 [16];
  pointer local_b8;
  microseconds mStack_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::GetAddrBytes(&local_socket_bytes,(CNetAddr *)&requestor->addrBind);
  GetDeterministicRandomizer((CSipHasher *)local_c8,this,0x1cf2e4ddd306dda9);
  NVar2 = CNode::ConnectedThroughNetwork(requestor);
  pCVar3 = CSipHasher::Write((CSipHasher *)local_c8,(ulong)NVar2);
  data_00.m_size =
       (long)local_socket_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)local_socket_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
  data_00.m_data =
       local_socket_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  pCVar3 = CSipHasher::Write(pCVar3,data_00);
  if (requestor->m_conn_type == INBOUND) {
    uVar1 = CService::GetPort(&(requestor->addrBind).super_CService);
    data = (uint64_t)uVar1;
  }
  else {
    data = 0;
  }
  pCVar3 = CSipHasher::Write(pCVar3,data);
  cache_id = CSipHasher::Finalize(pCVar3);
  tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1000000l>>>>
                    ();
  local_b8 = (pointer)0x0;
  mStack_b0.__r = 0;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_8_ = (pointer)0x0;
  pVar7 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,CConnman::CachedAddrResponse>,std::_Select1st<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>>
          ::_M_emplace_unique<unsigned_long&,CConnman::CachedAddrResponse>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,CConnman::CachedAddrResponse>,std::_Select1st<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>>
                      *)&this->m_addr_response_caches,&cache_id,(CachedAddrResponse *)local_c8);
  _Var5 = pVar7.first._M_node;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_c8);
  if (*(long *)(_Var5._M_node + 2) < (long)tVar4.__d.__r) {
    GetAddresses((vector<CAddress,_std::allocator<CAddress>_> *)local_c8,this,max_addresses,max_pct,
                 (optional<Network>)0x0,true);
    std::vector<CAddress,_std::allocator<CAddress>_>::_M_move_assign
              ((vector<CAddress,_std::allocator<CAddress>_> *)&_Var5._M_node[1]._M_parent);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_c8);
    FastRandomContext::FastRandomContext((FastRandomContext *)local_c8,false);
    lVar6 = RandomMixin<FastRandomContext>::randrange<long>
                      ((RandomMixin<FastRandomContext> *)local_c8,21600000000);
    *(long *)(_Var5._M_node + 2) = (long)tVar4.__d.__r + 75600000000 + lVar6;
    ChaCha20::~ChaCha20((ChaCha20 *)&local_b8);
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (__return_storage_ptr__,
             (vector<CAddress,_std::allocator<CAddress>_> *)&_Var5._M_node[1]._M_parent);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_socket_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CAddress> CConnman::GetAddresses(CNode& requestor, size_t max_addresses, size_t max_pct)
{
    auto local_socket_bytes = requestor.addrBind.GetAddrBytes();
    uint64_t cache_id = GetDeterministicRandomizer(RANDOMIZER_ID_ADDRCACHE)
        .Write(requestor.ConnectedThroughNetwork())
        .Write(local_socket_bytes)
        // For outbound connections, the port of the bound address is randomly
        // assigned by the OS and would therefore not be useful for seeding.
        .Write(requestor.IsInboundConn() ? requestor.addrBind.GetPort() : 0)
        .Finalize();
    const auto current_time = GetTime<std::chrono::microseconds>();
    auto r = m_addr_response_caches.emplace(cache_id, CachedAddrResponse{});
    CachedAddrResponse& cache_entry = r.first->second;
    if (cache_entry.m_cache_entry_expiration < current_time) { // If emplace() added new one it has expiration 0.
        cache_entry.m_addrs_response_cache = GetAddresses(max_addresses, max_pct, /*network=*/std::nullopt);
        // Choosing a proper cache lifetime is a trade-off between the privacy leak minimization
        // and the usefulness of ADDR responses to honest users.
        //
        // Longer cache lifetime makes it more difficult for an attacker to scrape
        // enough AddrMan data to maliciously infer something useful.
        // By the time an attacker scraped enough AddrMan records, most of
        // the records should be old enough to not leak topology info by
        // e.g. analyzing real-time changes in timestamps.
        //
        // It takes only several hundred requests to scrape everything from an AddrMan containing 100,000 nodes,
        // so ~24 hours of cache lifetime indeed makes the data less inferable by the time
        // most of it could be scraped (considering that timestamps are updated via
        // ADDR self-announcements and when nodes communicate).
        // We also should be robust to those attacks which may not require scraping *full* victim's AddrMan
        // (because even several timestamps of the same handful of nodes may leak privacy).
        //
        // On the other hand, longer cache lifetime makes ADDR responses
        // outdated and less useful for an honest requestor, e.g. if most nodes
        // in the ADDR response are no longer active.
        //
        // However, the churn in the network is known to be rather low. Since we consider
        // nodes to be "terrible" (see IsTerrible()) if the timestamps are older than 30 days,
        // max. 24 hours of "penalty" due to cache shouldn't make any meaningful difference
        // in terms of the freshness of the response.
        cache_entry.m_cache_entry_expiration = current_time +
            21h + FastRandomContext().randrange<std::chrono::microseconds>(6h);
    }
    return cache_entry.m_addrs_response_cache;
}